

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  size_t sVar1;
  int in_ECX;
  ulong uVar2;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int _c_00;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  Mat *pMVar3;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  Allocator *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  int local_40;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffe0;
  
  _c_00 = (int)((ulong)in_R9 >> 0x20);
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX * in_ECX * in_R8D) {
    pMVar3 = in_RDI;
    if ((int)in_RSI[5] < 3) {
      uVar2 = (long)in_EDX * (long)in_ECX;
      sVar1 = ncnn::alignSize((long)in_EDX * (long)in_ECX * in_RSI[2],0x10);
      if (uVar2 != sVar1 / (ulong)in_RSI[2]) {
        Mat(in_RDI);
        create(pMVar3,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)(uVar2 >> 0x20),
               in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (Allocator *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_40 * in_RDI->cstep * in_RDI->elemsize),
                 (void *)(*in_RSI + (long)local_40 * (long)in_EDX * (long)in_ECX * in_RSI[2]),
                 (long)in_EDX * (long)in_ECX * in_RSI[2]);
        }
        return pMVar3;
      }
    }
    else if ((int)in_RSI[7] != in_R8D) {
      reshape(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0,_c_00,
              (Allocator *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      ~Mat((Mat *)0x16b8a0);
      return in_RDI;
    }
    Mat(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    in_RDI->dims = 3;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->d = 1;
    in_RDI->c = in_R8D;
    sVar1 = ncnn::alignSize((long)in_EDX * (long)in_ECX * in_RSI[2],0x10);
    in_RDI->cstep = sVar1 / (ulong)in_RSI[2];
  }
  else {
    Mat(in_RDI);
    pMVar3 = in_RDI;
  }
  return pMVar3;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize((size_t)_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * elemsize, 16) / elemsize;

    return m;
}